

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O1

u32 duckdb_fsst_import(duckdb_fsst_decoder_t *decoder,u8 *buf)

{
  byte bVar1;
  undefined8 uVar2;
  u32 uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  u32 uVar10;
  ulong uVar11;
  undefined8 local_28;
  u8 lenHisto [8];
  
  uVar10 = 0;
  if (*(int *)(buf + 4) == 0x134140a) {
    bVar1 = buf[8];
    uVar4 = bVar1 & 1;
    decoder->zeroTerminated = (uchar)uVar4;
    uVar2 = *(undefined8 *)(buf + 9);
    local_28 = uVar2;
    decoder->len[0] = '\x01';
    decoder->symbol[0] = 0;
    if ((bVar1 & 1) != 0) {
      local_28._0_1_ = (char)uVar2;
      local_28 = CONCAT71((int7)((ulong)uVar2 >> 8),(char)local_28 + -1);
    }
    uVar10 = 0x11;
    uVar9 = 1;
    do {
      bVar1 = *(byte *)((long)&local_28 + (ulong)(uVar9 & 7));
      if (bVar1 != 0) {
        uVar7 = 0;
        do {
          uVar3 = uVar10;
          uVar6 = (ulong)uVar4;
          decoder->len[uVar6] = (char)(uVar9 & 7) + '\x01';
          decoder->symbol[uVar6] = 0;
          uVar11 = 0;
          do {
            *(u8 *)((long)decoder->symbol + uVar11 + uVar6 * 8) = buf[uVar3 + (int)uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar11 < decoder->len[uVar6]);
          uVar7 = uVar7 + 1;
          uVar4 = uVar4 + 1;
          uVar10 = uVar3 + (int)uVar11;
        } while (uVar7 != bVar1);
        uVar10 = uVar3 + (int)uVar11;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 9);
    if (uVar4 < 0xff) {
      lVar8 = (ulong)uVar4 + 0x21;
      do {
        builtin_memcpy(decoder->len + lVar8 * 8 + -9,"corrupt",8);
        decoder->len[lVar8 + -0x21] = '\b';
        iVar5 = (int)lVar8;
        lVar8 = lVar8 + 1;
      } while (iVar5 != 0x11f);
    }
  }
  return uVar10;
}

Assistant:

u32 duckdb_fsst_import(duckdb_fsst_decoder_t *decoder, u8 *buf) {
	u64 version = 0;
	u32 code, pos = 17;
	u8 lenHisto[8];

	// version field (first 8 bytes) is now there just for future-proofness, unused still (skipped)
	memcpy(&version, buf, 8);
	if ((version>>32) != FSST_VERSION) return 0;
	decoder->zeroTerminated = buf[8]&1;
	memcpy(lenHisto, buf+9, 8);

	// in case of zero-terminated, first symbol is "" (zero always, may be overwritten)
	decoder->len[0] = 1;
	decoder->symbol[0] = 0;

	// we use lenHisto[0] as 1-byte symbol run length (at the end)
	code = decoder->zeroTerminated;
	if (decoder->zeroTerminated) lenHisto[0]--; // if zeroTerminated, then symbol "" aka 1-byte code=0, is not stored at the end

	// now get all symbols from the buffer
	for(u32 l=1; l<=8; l++) { /* l = 1,2,3,4,5,6,7,8 */
		for(u32 i=0; i < lenHisto[(l&7) /* 1,2,3,4,5,6,7,0 */]; i++, code++)  {
			decoder->len[code] = (l&7)+1; /* len = 2,3,4,5,6,7,8,1  */
			decoder->symbol[code] = 0;
			for(u32 j=0; j<decoder->len[code]; j++)
				((u8*) &decoder->symbol[code])[j] = buf[pos++]; // note this enforces 'little endian' symbols
		}
	}
	if (decoder->zeroTerminated) lenHisto[0]++;

	// fill unused symbols with text "corrupt". Gives a chance to detect corrupted code sequences (if there are unused symbols).
	while(code<255) {
		decoder->symbol[code] = FSST_CORRUPT;
		decoder->len[code++] = 8;
	}
	return pos;
}